

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.cpp
# Opt level: O0

void makeIntColumns(Matrix<Rational> *m)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  Rational *b;
  Matrix<Rational> *in_RDI;
  uint i_1;
  uint i;
  uint neg;
  uint pos;
  BigInteger g;
  uint col;
  Rational *in_stack_fffffffffffffd08;
  Rational *in_stack_fffffffffffffd10;
  row_t in_stack_fffffffffffffd18;
  uint in_stack_fffffffffffffd20;
  uint in_stack_fffffffffffffd24;
  BigInteger *in_stack_fffffffffffffd30;
  undefined7 in_stack_fffffffffffffd38;
  undefined1 in_stack_fffffffffffffd3f;
  row_t in_stack_fffffffffffffd48;
  undefined7 in_stack_fffffffffffffd50;
  undefined1 in_stack_fffffffffffffd57;
  row_t in_stack_fffffffffffffd78;
  Rational *in_stack_fffffffffffffd80;
  MatrixRow<Rational_&> local_248 [9];
  uint local_1fc;
  BigInteger local_1f8 [3];
  MatrixRow<Rational_&> local_198 [9];
  MatrixRow<Rational_&> local_150;
  MatrixRow<Rational_&> local_148 [13];
  MatrixRow<Rational_&> local_e0 [13];
  MatrixRow<Rational_&> local_78 [7];
  uint local_3c;
  uint local_38;
  uint local_34;
  uint local_c;
  Matrix<Rational> *local_8;
  
  local_8 = in_RDI;
  for (local_c = 0; uVar1 = local_c, uVar3 = Matrix<Rational>::width(local_8), uVar1 < uVar3;
      local_c = local_c + 1) {
    BigInteger::BigInteger
              ((BigInteger *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
               (longlong)in_stack_fffffffffffffd18.arr);
    local_34 = 0;
    local_38 = 0;
    for (local_3c = 0; uVar1 = local_3c, uVar3 = Matrix<Rational>::height(local_8), uVar1 < uVar3;
        local_3c = local_3c + 1) {
      local_78[0].arr = (Rational *)Matrix<Rational>::operator[](in_stack_fffffffffffffd08,0);
      Matrix<Rational>::MatrixRow<Rational_&>::operator[](local_78,local_c);
      Rational::denominator(in_stack_fffffffffffffd08);
      BigInteger::BigInteger
                ((BigInteger *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                 (longlong)in_stack_fffffffffffffd18.arr);
      bVar2 = operator!=(&in_stack_fffffffffffffd10->_numerator,
                         &in_stack_fffffffffffffd08->_numerator);
      BigInteger::~BigInteger((BigInteger *)0x151e11);
      BigInteger::~BigInteger((BigInteger *)0x151e1e);
      if (bVar2) {
        local_e0[0].arr = (Rational *)Matrix<Rational>::operator[](in_stack_fffffffffffffd08,0);
        in_stack_fffffffffffffd80 =
             Matrix<Rational>::MatrixRow<Rational_&>::operator[](local_e0,local_c);
        Rational::denominator(in_stack_fffffffffffffd08);
        BigInteger::BigInteger
                  (&in_stack_fffffffffffffd10->_numerator,&in_stack_fffffffffffffd08->_numerator);
        in_stack_fffffffffffffd78 = Matrix<Rational>::operator[](in_stack_fffffffffffffd08,0);
        local_148[0].arr = in_stack_fffffffffffffd78.arr;
        b = Matrix<Rational>::MatrixRow<Rational_&>::operator[](local_148,local_c);
        Rational::denominator(in_stack_fffffffffffffd08);
        gcd(&(in_stack_fffffffffffffd78.arr)->_numerator,&b->_numerator);
        operator/((BigInteger *)CONCAT17(in_stack_fffffffffffffd3f,in_stack_fffffffffffffd38),
                  in_stack_fffffffffffffd30);
        BigInteger::operator*=
                  ((BigInteger *)CONCAT17(in_stack_fffffffffffffd57,in_stack_fffffffffffffd50),
                   &(in_stack_fffffffffffffd48.arr)->_numerator);
        BigInteger::~BigInteger((BigInteger *)0x151f59);
        BigInteger::~BigInteger((BigInteger *)0x151f66);
        BigInteger::~BigInteger((BigInteger *)0x151f73);
        BigInteger::~BigInteger((BigInteger *)0x151f80);
        BigInteger::~BigInteger((BigInteger *)0x151f8d);
      }
      local_150.arr = (Rational *)Matrix<Rational>::operator[](in_stack_fffffffffffffd08,0);
      Matrix<Rational>::MatrixRow<Rational_&>::operator[](&local_150,local_c);
      Rational::Rational(in_stack_fffffffffffffd10,(longlong)in_stack_fffffffffffffd08);
      in_stack_fffffffffffffd57 = operator>(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
      local_34 = local_34 + (byte)in_stack_fffffffffffffd57;
      Rational::~Rational(in_stack_fffffffffffffd10);
      in_stack_fffffffffffffd48 = Matrix<Rational>::operator[](in_stack_fffffffffffffd08,0);
      local_198[0].arr = in_stack_fffffffffffffd48.arr;
      Matrix<Rational>::MatrixRow<Rational_&>::operator[](local_198,local_c);
      Rational::Rational(in_stack_fffffffffffffd10,(longlong)in_stack_fffffffffffffd08);
      in_stack_fffffffffffffd3f = operator<(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08);
      local_38 = (byte)in_stack_fffffffffffffd3f + local_38;
      Rational::~Rational(in_stack_fffffffffffffd10);
    }
    if (local_34 < local_38) {
      in_stack_fffffffffffffd30 = local_1f8;
      BigInteger::operator-(&(in_stack_fffffffffffffd18.arr)->_numerator);
      BigInteger::operator=
                (&in_stack_fffffffffffffd10->_numerator,&in_stack_fffffffffffffd08->_numerator);
      BigInteger::~BigInteger((BigInteger *)0x1521fa);
    }
    local_1fc = 0;
    while (in_stack_fffffffffffffd20 = local_1fc,
          in_stack_fffffffffffffd24 = Matrix<Rational>::height(local_8),
          in_stack_fffffffffffffd20 < in_stack_fffffffffffffd24) {
      Rational::Rational(in_stack_fffffffffffffd10,&in_stack_fffffffffffffd08->_numerator);
      in_stack_fffffffffffffd18 = Matrix<Rational>::operator[](in_stack_fffffffffffffd08,0);
      local_248[0].arr = in_stack_fffffffffffffd18.arr;
      in_stack_fffffffffffffd10 =
           Matrix<Rational>::MatrixRow<Rational_&>::operator[](local_248,local_c);
      Rational::operator*=(in_stack_fffffffffffffd80,in_stack_fffffffffffffd78.arr);
      Rational::~Rational(in_stack_fffffffffffffd10);
      local_1fc = local_1fc + 1;
    }
    BigInteger::~BigInteger((BigInteger *)0x15231c);
  }
  return;
}

Assistant:

void makeIntColumns(Matrix<Rational> &m)
{
    for(unsigned col = 0; col < m.width(); ++col)
    {
        BigInteger g = 1;
        unsigned pos = 0, neg = 0;
        for(unsigned i = 0; i < m.height(); ++i)
        {
            if(m[i][col].denominator() != 1)
                g *= m[i][col].denominator() / gcd(g, m[i][col].denominator());
            pos += m[i][col] > 0;
            neg += m[i][col] < 0;
        }
        if(neg > pos)
            g = -g;
        for(unsigned i = 0; i < m.height(); ++i)
        {
            m[i][col] *= g;
        }
    }
}